

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O3

SymbolTableRes * constructSymbolTable(SymbolTableRes *__return_storage_ptr__,CProgram *program)

{
  CConstructSymbolTableVisitor symbol_table_visitor;
  vector<CError,_std::allocator<CError>_> local_98;
  CConstructSymbolTableVisitor local_78;
  vector<CError,_std::allocator<CError>_> local_38;
  
  CConstructSymbolTableVisitor::CConstructSymbolTableVisitor(&local_78);
  (**(program->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(program,&local_78);
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CConstructSymbolTableVisitor::GetSymbolTable(&local_78);
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_98.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
           super__Vector_impl_data._M_start;
  (__return_storage_ptr__->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_98.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  CConstructSymbolTableVisitor::GetErrors(&local_38,&local_78);
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->errors).super__Vector_base<CError,_std::allocator<CError>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_98.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<CError,_std::allocator<CError>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_98);
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_38);
  local_78.super_IVisitor._vptr_IVisitor = (_func_int **)&PTR_Visit_00180a40;
  std::vector<CError,_std::allocator<CError>_>::~vector(&local_78.errors);
  if (local_78.info.super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.info.super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.table.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.table.super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

SymbolTableRes constructSymbolTable( CProgram *program ) {
    CConstructSymbolTableVisitor symbol_table_visitor = CConstructSymbolTableVisitor( );
    program->Accept( symbol_table_visitor );

    SymbolTableRes res;
    res.symbolTable = symbol_table_visitor.GetSymbolTable( );
    res.errors = symbol_table_visitor.GetErrors( );

    return res;
}